

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

shared_ptr<cxxopts::Value> __thiscall cxxopts::value<unsigned_long>(cxxopts *this,unsigned_long *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cxxopts::Value> sVar2;
  unsigned_long *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  unsigned_long *local_10;
  
  local_10 = t;
  std::make_shared<cxxopts::values::standard_value<unsigned_long>,unsigned_long*>(&local_28);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(unsigned_long **)this = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_28 = (unsigned_long *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  sVar2.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<cxxopts::Value>)
         sVar2.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
    value(T& t)
    {
        return std::make_shared<values::standard_value<T>>(&t);
    }